

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayColorDepthAttachments.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArrayColorDepthAttachmentsTest::prepareMutableTextureObject
          (TextureCubeMapArrayColorDepthAttachmentsTest *this,GLuint texture_id,GLuint texture_size,
          GLuint n_cubemaps,bool should_take_color_texture_properties)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined7 in_register_00000081;
  GLenum GVar4;
  GLenum GVar5;
  undefined8 uVar6;
  bool bVar7;
  long lVar3;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  bVar7 = (int)CONCAT71(in_register_00000081,should_take_color_texture_properties) != 0;
  uVar6 = 0x1902;
  if (bVar7) {
    uVar6 = 0x8d94;
  }
  GVar4 = 0x8235;
  if (!bVar7) {
    GVar4 = this->m_depth_internal_format;
  }
  GVar5 = 0x1404;
  if (!bVar7) {
    GVar5 = this->m_depth_type;
  }
  (**(code **)(lVar3 + 0xb8))(0x9009,texture_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindTexture() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0x2f1);
  (**(code **)(lVar3 + 0x1320))
            (0x9009,0,GVar4,texture_size,texture_size,n_cubemaps * 6,0,uVar6,GVar5,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glTexImage3D() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0x2f7);
  (**(code **)(lVar3 + 0x1360))(0x9009,0x813d,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glTexParameteri() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0x2fc);
  return;
}

Assistant:

void TextureCubeMapArrayColorDepthAttachmentsTest::prepareMutableTextureObject(
	glw::GLuint texture_id, glw::GLuint texture_size, glw::GLuint n_cubemaps, bool should_take_color_texture_properties)
{
	const glw::Functions& gl			  = m_context.getRenderContext().getFunctions();
	glw::GLenum			  format		  = GL_NONE;
	glw::GLenum			  internal_format = GL_NONE;
	glw::GLenum			  type			  = GL_NONE;

	/* Set internal_format, format and type accordingly to requested texture type */
	if (true == should_take_color_texture_properties)
	{
		internal_format = m_color_internal_format;
		format			= m_color_format;
		type			= m_color_type;
	}
	else
	{
		internal_format = m_depth_internal_format;
		format			= m_depth_format;
		type			= m_depth_type;
	}

	/* Bind the texture object to GL_TEXTURE_CUBE_MAP_ARRAY texture target. */
	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, texture_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed");

	/* Initialize mutable texture storage as per description */
	gl.texImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0 /* mipmap_level */, internal_format, texture_size, texture_size,
				  n_cubemaps * 6 /* layer-faces per cube-map */, 0 /* border */, format, type,
				  DE_NULL); /* initial data */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage3D() call failed");

	/* Update GL_TEXTURE_MAX_LEVEL so that the texture is considered complete */
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAX_LEVEL, 0 /* param */);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri() call failed");
}